

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  FastWriter *in_RSI;
  char *pcVar3;
  long in_RDI;
  int in_stack_0000002c;
  Value *in_stack_00000030;
  Value *in_stack_00000038;
  Value *in_stack_00000048;
  string *name;
  iterator it;
  Members members;
  int index;
  int size;
  uint in_stack_000000e4;
  char *in_stack_000000e8;
  bool ok;
  char *end;
  char *str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe78;
  Value *in_stack_fffffffffffffe80;
  char **in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  string *psVar4;
  Value *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea8;
  undefined1 value_00;
  string local_138 [16];
  double in_stack_fffffffffffffed8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100 [4];
  int local_e0;
  ArrayIndex local_dc;
  string local_d8 [32];
  string local_b8 [39];
  undefined1 local_91;
  string local_80 [32];
  string local_60 [48];
  string local_30 [24];
  Value *in_stack_ffffffffffffffe8;
  
  value_00 = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  VVar2 = Value::type((Value *)in_RSI);
  switch(VVar2) {
  case nullValue:
    if ((*(byte *)(in_RDI + 0x29) & 1) == 0) {
      std::__cxx11::string::operator+=((string *)(in_RDI + 8),"null");
    }
    break;
  case intValue:
    Value::asLargestInt((Value *)0x130ff8);
    valueToString_abi_cxx11_((LargestInt)in_stack_fffffffffffffed8);
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),local_30);
    std::__cxx11::string::~string(local_30);
    break;
  case uintValue:
    Value::asLargestUInt((Value *)0x131067);
    psVar4 = local_60;
    valueToString_abi_cxx11_((LargestUInt)in_stack_fffffffffffffed8);
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),psVar4);
    std::__cxx11::string::~string(local_60);
    break;
  case realValue:
    Value::asDouble(in_stack_00000048);
    valueToString_abi_cxx11_(in_stack_fffffffffffffed8);
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),local_80);
    std::__cxx11::string::~string(local_80);
    break;
  case stringValue:
    local_91 = Value::getString(in_stack_fffffffffffffe98,(char **)in_stack_fffffffffffffe90,
                                in_stack_fffffffffffffe88);
    if ((bool)local_91) {
      psVar4 = local_b8;
      valueToQuotedStringN_abi_cxx11_(in_stack_000000e8,in_stack_000000e4);
      std::__cxx11::string::operator+=((string *)(in_RDI + 8),psVar4);
      std::__cxx11::string::~string(local_b8);
    }
    break;
  case booleanValue:
    Value::asBool(in_stack_00000038);
    psVar4 = local_d8;
    valueToString_abi_cxx11_((bool)value_00);
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),psVar4);
    std::__cxx11::string::~string(local_d8);
    break;
  case arrayValue:
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),'[');
    local_dc = Value::size(in_stack_fffffffffffffe98);
    for (local_e0 = 0; local_e0 < (int)local_dc; local_e0 = local_e0 + 1) {
      if (0 < local_e0) {
        std::__cxx11::string::operator+=((string *)(in_RDI + 8),',');
      }
      Value::operator[](in_stack_00000030,in_stack_0000002c);
      writeValue(in_RSI,in_stack_ffffffffffffffe8);
    }
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),']');
    break;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(_index);
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),'{');
    local_100[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffe78);
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(in_stack_fffffffffffffe78);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin(in_stack_fffffffffffffe78);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe78);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)(in_RDI + 8),',');
      }
      std::__cxx11::string::data();
      std::__cxx11::string::length();
      valueToQuotedStringN_abi_cxx11_(in_stack_000000e8,in_stack_000000e4);
      std::__cxx11::string::operator+=((string *)(in_RDI + 8),local_138);
      std::__cxx11::string::~string(local_138);
      pcVar3 = ":";
      if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
        pcVar3 = ": ";
      }
      std::__cxx11::string::operator+=((string *)(in_RDI + 8),pcVar3);
      in_stack_fffffffffffffe80 =
           Value::operator[](in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      writeValue(in_RSI,in_stack_ffffffffffffffe8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(local_100);
    }
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),'}');
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe90);
  }
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) document_ += valueToQuotedStringN(str, static_cast<unsigned>(end-str));
    break;
  }
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    int size = value.size();
    for (int index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (Value::Members::iterator it = members.begin(); it != members.end();
         ++it) {
      const std::string& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedStringN(name.data(), name.length());
      document_ += yamlCompatiblityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}